

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  list<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
  *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _List_node_base *p_Var4;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *puVar5;
  undefined *puVar6;
  char *pcVar7;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> curr;
  pointer __p;
  pointer __p_00;
  Module *wasm;
  Function *pFVar8;
  _Base_ptr p_Var9;
  Global *pGVar10;
  ulong in_RCX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  _List_node_base *p_Var11;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  __node_base *p_Var12;
  pointer puVar13;
  string_view in;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_stack_fffffffffffffaf8;
  undefined1 local_500 [8];
  Module intrinsicsModule;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_e8;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_c8;
  undefined1 local_a8 [8];
  Result<wasm::Ok> parsed;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> local_38;
  __single_object global_1;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RCX;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)0x0,(IString)(auVar2 << 0x40));
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    __p_00 = (pointer)operator_new(8);
    __p_00->wasm = module;
    local_500 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&this->builder
               ,__p_00);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)local_500);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,module);
  if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
    Module::Module((Module *)local_500);
    puVar6 = IntrinsicsModuleWast;
    wasm = (Module *)strlen(IntrinsicsModuleWast);
    in._M_str = (char *)&intrinsicsModule.tagsMap._M_h._M_single_bucket;
    in._M_len = (size_t)puVar6;
    WATParser::parseModule((Result<wasm::Ok> *)local_a8,(WATParser *)local_500,wasm,in,in_R9);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&intrinsicsModule.tagsMap._M_h._M_single_bucket);
    if (parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      __assert_fail("!parsed.getErr()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveNonJSOps.cpp"
                    ,0x54,"void wasm::RemoveNonJSOpsPass::doWalkModule(Module *)");
    }
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&neededFunctions;
    neededFunctions._M_t._M_impl._0_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    this_00 = &this->neededIntrinsics;
    puVar5 = &this->neededIntrinsics;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    while (puVar13 = intrinsicsModule.functions.
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
          p_Var12 = &(puVar5->_M_h)._M_before_begin,
          (this->neededIntrinsics)._M_h._M_element_count != 0) {
      while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
        addNeededFunctions(this,(Module *)local_500,(Name)*(string_view *)(p_Var12 + 1),
                           (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                           ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&this_00->_M_h);
      for (p_Var9 = neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 != (_Rb_tree_node_base *)&neededFunctions;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        pFVar8 = Module::getFunctionOrNull(module,(Name)*(string_view *)(p_Var9 + 1));
        if (pFVar8 == (Function *)0x0) {
          pFVar8 = Module::getFunction((Module *)local_500,(Name)*(string_view *)(p_Var9 + 1));
          local_e8._M_engaged = false;
          local_c8._M_engaged = false;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = &local_e8;
          pFVar8 = wasm::ModuleUtils::copyFunction
                             ((ModuleUtils *)pFVar8,(Function *)module,(Module *)0x0,
                              (Name)(auVar3 << 0x40),
                              (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                              )&local_c8,in_stack_fffffffffffffaf8);
          std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
          _M_reset(&local_c8);
          std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
          _M_reset(&local_e8);
          this = (RemoveNonJSOpsPass *)
                 neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        doWalkFunction(this,pFVar8);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    for (; puVar13 !=
           (pointer)intrinsicsModule.globals.
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar13 = puVar13 + 1) {
      wasm::ModuleUtils::copyGlobal
                ((Global *)
                 (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,module);
    }
    MemoryUtils::ensureExists(module);
    plVar1 = &(this->neededImportedGlobals).List;
    p_Var11 = (_List_node_base *)plVar1;
    while (p_Var11 = (((_List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
                        *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var11 != (_List_node_base *)plVar1) {
      pGVar10 = Module::getGlobalOrNull
                          ((this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                           .
                           super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                           .currModule,(Name)p_Var11[1]);
      if (pGVar10 == (Global *)0x0) {
        std::make_unique<wasm::Global>();
        curr._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             local_38._M_t.
             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        p_Var4 = p_Var11[1]._M_prev;
        *(_List_node_base **)
         local_38._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = p_Var11[1]._M_next;
        *(_List_node_base **)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8) = p_Var4;
        ((Type *)((long)local_38._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38))->id =
             (uintptr_t)p_Var11[2]._M_next;
        *(bool *)((long)local_38._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) = false;
        pcVar7 = DAT_01174c48;
        (((Name *)((long)local_38._M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18))->
        super_IString).str._M_len = ENV;
        *(char **)((long)local_38._M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) = pcVar7;
        p_Var4 = p_Var11[1]._M_prev;
        (((Name *)((long)local_38._M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28))->
        super_IString).str._M_len = (size_t)p_Var11[1]._M_next;
        *(_List_node_base **)
         ((long)local_38._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30) = p_Var4;
        local_38._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
             (_Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>)0x0;
        Module::addGlobal(module,(Global *)
                                 curr._M_t.
                                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                 .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                  ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
    Module::~Module((Module *)local_500);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    [[maybe_unused]] auto parsed =
      WATParser::parseModule(intrinsicsModule, IntrinsicsModuleWast);
    assert(!parsed.getErr());

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }